

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo3.cpp
# Opt level: O1

int64_t primesum::pi_lmo3(int64_t x)

{
  int iVar1;
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  int *piVar2;
  int *piVar3;
  int iVar4;
  ulong uVar5;
  pointer pcVar6;
  int128_t *piVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int64_t iVar14;
  long lVar15;
  long r;
  long lVar16;
  pointer __n;
  long lVar17;
  long lVar18;
  int128_t *piVar19;
  int *piVar20;
  bool bVar21;
  double dVar22;
  double dVar23;
  vector<int,_std::allocator<int>_> primes;
  vector<char,_std::allocator<char>_> sieve;
  vector<long,_std::allocator<long>_> next;
  vector<int,_std::allocator<int>_> lpf;
  vector<int,_std::allocator<int>_> mu;
  vector<long,_std::allocator<long>_> phi;
  int256_t s1;
  int256_t p2;
  undefined8 in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe80;
  size_type local_178;
  vector<int,_std::allocator<int>_> local_170;
  long local_158;
  vector<char,_std::allocator<char>_> local_150;
  long local_138;
  void *local_130 [2];
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  int128_t *local_f8;
  long local_f0;
  int128_t *local_e8;
  int64_t local_e0;
  pointer local_d8;
  pointer local_d0;
  vector<int,_std::allocator<int>_> local_c8;
  vector<int,_std::allocator<int>_> local_b0;
  vector<long,_std::allocator<long>_> local_98;
  value_type_conflict7 local_80;
  int256_t local_78;
  int256_t local_58;
  
  if (x < 2) {
    iVar14 = 0;
  }
  else {
    x_00._8_8_ = in_stack_fffffffffffffe80;
    x_00._0_8_ = in_stack_fffffffffffffe78;
    dVar22 = get_alpha_lmo((primesum *)x,(int128_t)x_00);
    dVar23 = pow((double)x,0.3333333333333333);
    lVar8 = (long)dVar23;
    if (0 < lVar8) {
      do {
        lVar16 = 1;
        iVar4 = 2;
        do {
          lVar16 = lVar16 * lVar8;
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
        if (lVar16 - x / lVar8 == 0 || lVar16 < x / lVar8) goto LAB_0011f685;
        bVar21 = 1 < lVar8;
        lVar8 = lVar8 + -1;
      } while (bVar21);
      lVar8 = 0;
    }
LAB_0011f685:
    do {
      lVar16 = lVar8;
      lVar8 = lVar16 + 1;
      lVar17 = 1;
      iVar4 = 2;
      do {
        lVar17 = lVar17 * lVar8;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    } while (lVar17 - x / lVar8 == 0 || lVar17 < x / lVar8);
    piVar19 = (int128_t *)(long)(dVar22 * (double)lVar16);
    lVar8 = 6;
    if ((long)piVar19 < 0xd) {
      lVar8 = (long)*(int *)(PhiTiny::pi + (long)piVar19 * 4);
    }
    x_01._8_8_ = dVar22;
    x_01._0_8_ = in_stack_fffffffffffffe78;
    P2(&local_58,(primesum *)x,(int128_t)x_01,0,(int)piVar19);
    generate_moebius(&local_b0,(int64_t)piVar19);
    generate_lpf(&local_c8,(int64_t)piVar19);
    generate_primes(&local_170,(int64_t)piVar19);
    x_02._8_8_ = dVar22;
    x_02._0_8_ = in_stack_fffffffffffffe78;
    S1(&local_78,(primesum *)x,(int128_t)x_02,0,(int64_t)piVar19,(int)lVar8);
    local_138 = x / (long)piVar19;
    lVar16 = local_138 + 1;
    dVar22 = (double)lVar16;
    if (dVar22 < 0.0) {
      dVar22 = sqrt(dVar22);
    }
    else {
      dVar22 = SQRT(dVar22);
    }
    lVar17 = 0xb504f333;
    if ((long)dVar22 < 0xb504f333) {
      lVar17 = (long)dVar22;
    }
    lVar9 = lVar17 * 2;
    do {
      lVar12 = lVar17 * lVar17;
      lVar9 = lVar9 + -2;
      lVar15 = lVar17;
      lVar17 = lVar17 + -1;
    } while (lVar12 - lVar16 != 0 && lVar16 <= lVar12);
    do {
      lVar17 = lVar15;
      lVar9 = lVar9 + 2;
      lVar15 = lVar17 + 1;
    } while (lVar9 < lVar16 - lVar17 * lVar17);
    local_178 = 1;
    if (lVar17 + 1 != 1) {
      uVar5 = lVar17 - 1;
      lVar17 = 1;
      do {
        uVar5 = (long)uVar5 >> ((byte)lVar17 & 0x3f) | uVar5;
        bVar21 = lVar17 < 0x20;
        lVar17 = lVar17 * 2;
      } while (bVar21);
      local_178 = uVar5 + 1;
    }
    piVar20 = local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + 1;
    piVar3 = piVar20;
    uVar5 = (long)local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar20 >> 2;
    while (piVar2 = piVar3, 0 < (long)uVar5) {
      uVar10 = uVar5 >> 1;
      uVar5 = ~uVar10 + uVar5;
      piVar3 = piVar2 + uVar10 + 1;
      if ((long)piVar19 < (long)piVar2[uVar10]) {
        piVar3 = piVar2;
        uVar5 = uVar10;
      }
    }
    std::vector<char,_std::allocator<char>_>::vector
              (&local_150,local_178,(allocator_type *)local_130);
    std::vector<long,std::allocator<long>>::
    vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
              ((vector<long,std::allocator<long>> *)local_130,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(allocator_type *)&local_98);
    __n = (pointer)((long)local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2);
    local_80 = 0;
    std::vector<long,_std::allocator<long>_>::vector
              (&local_98,(size_type)__n,&local_80,(allocator_type *)&stack0xfffffffffffffe7f);
    if (local_138 < 1) {
      local_158 = 0;
    }
    else {
      lVar17 = (long)piVar2 - (long)piVar20 >> 2;
      lVar15 = -1;
      local_158 = 0;
      lVar9 = 1;
      local_118 = lVar16;
      local_108 = lVar17;
      local_100 = lVar8;
      local_f8 = piVar19;
      local_e0 = x;
      do {
        if (local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          __n = (pointer)0x1;
          memset(local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,1,
                 (long)local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start);
        }
        local_110 = lVar9 + local_178;
        lVar16 = local_110;
        if (local_118 < local_110) {
          lVar16 = local_118;
        }
        if (0 < lVar8) {
          lVar12 = 1;
          do {
            lVar11 = *(long *)((long)local_130[0] + lVar12 * 8);
            if (lVar11 < lVar16) {
              iVar4 = local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar12];
              do {
                __n = local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar15;
                __n[lVar11] = '\0';
                lVar11 = lVar11 + iVar4;
              } while (lVar11 < lVar16);
            }
            *(long *)((long)local_130[0] + lVar12 * 8) = lVar11;
            bVar21 = lVar12 != lVar8;
            lVar12 = lVar12 + 1;
          } while (bVar21);
        }
        local_f0 = lVar16 - lVar9;
        lVar12 = lVar8;
        do {
          lVar12 = lVar12 + 1;
          if (lVar17 <= lVar12) break;
          iVar4 = local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar12];
          lVar11 = (long)iVar4;
          pcVar6 = (pointer)(x / (lVar16 * lVar11));
          __n = (pointer)((long)piVar19 / lVar11);
          if ((long)piVar19 / lVar11 < (long)pcVar6) {
            __n = pcVar6;
          }
          piVar7 = (int128_t *)(x / (lVar9 * lVar11));
          if ((long)piVar19 <= (long)piVar7) {
            piVar7 = piVar19;
          }
          if (lVar11 < (long)piVar7) {
            if ((long)__n < (long)piVar7) {
              lVar8 = 0;
              local_d0 = local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
              local_d8 = local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
              piVar19 = piVar7;
              do {
                iVar1 = local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[(long)piVar19];
                if (((long)iVar1 != 0) &&
                   (iVar4 < local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[(long)piVar19])) {
                  lVar17 = x / ((long)piVar19 * lVar11) - lVar9;
                  if (lVar8 <= lVar17) {
                    lVar13 = local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar12];
                    lVar18 = lVar8;
                    do {
                      lVar13 = lVar13 + (long)local_150.
                                              super__Vector_base<char,_std::allocator<char>_>.
                                              _M_impl.super__Vector_impl_data._M_start[lVar18] *
                                        (lVar9 + lVar18);
                      local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar12] = lVar13;
                      lVar8 = lVar18 + 1;
                      bVar21 = lVar18 < lVar17;
                      lVar18 = lVar8;
                    } while (bVar21);
                  }
                  local_158 = local_158 -
                              (long)piVar19 * lVar11 * (long)iVar1 *
                              local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar12];
                  x = local_e0;
                }
                piVar19 = (int128_t *)((long)piVar19 + -1);
              } while ((long)__n < (long)piVar19);
            }
            else {
              lVar8 = 0;
            }
            if (lVar8 < local_f0) {
              lVar17 = local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar12];
              do {
                __n = (pointer)(lVar9 + lVar8);
                lVar17 = lVar17 + (long)local_150.super__Vector_base<char,_std::allocator<char>_>.
                                        _M_impl.super__Vector_impl_data._M_start[lVar8] * (long)__n;
                local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start[lVar12] = lVar17;
                lVar8 = lVar8 + 1;
              } while (lVar8 < local_f0);
            }
            lVar8 = *(long *)((long)local_130[0] + lVar12 * 8);
            if (lVar8 < lVar16) {
              do {
                __n = local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar15;
                __n[lVar8] = '\0';
                lVar8 = lVar8 + lVar11 * 2;
              } while (lVar8 < lVar16);
            }
            *(long *)((long)local_130[0] + lVar12 * 8) = lVar8;
            lVar8 = local_100;
            lVar17 = local_108;
            piVar19 = local_f8;
            local_e8 = piVar7;
          }
        } while (lVar11 < (long)piVar7);
        lVar15 = lVar15 - local_178;
        lVar9 = local_110;
      } while (local_110 <= local_138);
    }
    if (local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      __n = (pointer)((long)local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                     (long)local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start);
      operator_delete(local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,(ulong)__n);
    }
    if (local_130[0] != (void *)0x0) {
      __n = (pointer)(local_120 - (long)local_130[0]);
      operator_delete(local_130[0],(ulong)__n);
    }
    if (local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      __n = local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage +
            -(long)local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
      operator_delete(local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,(ulong)__n);
    }
    piVar19 = prime_sum_tiny(piVar19,(int64_t)__n);
    if (local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    lVar8 = (long)local_78.low + local_158;
    if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    iVar14 = (long)piVar19 + ~(ulong)local_58.low + lVar8;
  }
  return iVar14;
}

Assistant:

int64_t pi_lmo3(int64_t x)
{
  if (x < 2)
    return 0;

  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t c = PhiTiny::get_c(y);
  int256_t p2 = P2(x, y, 1);

  vector<int32_t> mu = generate_moebius(y);
  vector<int32_t> lpf = generate_lpf(y);
  vector<int32_t> primes = generate_primes(y);

  int256_t s1 = S1(x, y, c, 1);
  int256_t s2 = S2(x, y, c, primes, lpf, mu);
  int256_t phi = s1 + s2;
  int256_t sum = phi + prime_sum_tiny(y) - 1 - p2;

  return int64_t(sum);
}